

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_time_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_98339b::X509TimeTest_TestCmpTime_Test::~X509TimeTest_TestCmpTime_Test
          (X509TimeTest_TestCmpTime_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(X509TimeTest, TestCmpTime) {
  for (auto &test : kX509CmpTests) {
    SCOPED_TRACE(test.data);

    bssl::UniquePtr<ASN1_STRING> t(ASN1_STRING_type_new(test.type));
    ASSERT_TRUE(t);
    ASSERT_TRUE(ASN1_STRING_set(t.get(), test.data, strlen(test.data)));

    EXPECT_EQ(test.expected, X509_cmp_time_posix(t.get(), test.cmp_time));
  }
}